

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.cpp
# Opt level: O2

void * SRF02Thread(void *pParam)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  timeval tv;
  bool bVar6;
  bool bVar7;
  double dVar8;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  byte bVar17;
  long lStackY_d70;
  long local_d48;
  int local_d3c;
  timeval local_d38;
  double distances [16];
  double tab_values [3];
  double angles [16];
  double distances3 [16];
  double distances2 [16];
  double distances1 [16];
  CHRONO chrono_period;
  char szTemp [256];
  SRF02 srf02;
  char szCfgFilePath [256];
  char szSaveFilePath [256];
  
  bVar17 = 0;
  builtin_strncpy(szCfgFilePath,"SRF020.txt",0xb);
  memset(&srf02,0,0x700);
  StartChrono(&chrono_period);
  local_d48 = 0x32;
  bVar6 = false;
  local_d3c = 0;
LAB_0016f2af:
  bVar6 = !bVar6;
  do {
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      if (bPauseSRF02 == 0) break;
      if (!bVar6) {
        puts("SRF02 paused.");
        DisconnectSRF02(&srf02);
      }
      if (bExit != 0) {
LAB_0016fabb:
        bVar7 = true;
        goto LAB_0016fabe;
      }
      mSleep(100);
      bVar6 = true;
    }
    if (bRestartSRF02 != 0) {
      if (!bVar6) {
        puts("Restarting a SRF02.");
        DisconnectSRF02(&srf02);
      }
      bRestartSRF02 = 0;
LAB_0016f3d1:
      iVar9 = ConnectSRF02(&srf02,szCfgFilePath);
      if (iVar9 != 0) {
        mSleep(1000);
        local_d3c = local_d3c + 1;
        if (ExitOnErrorCount <= local_d3c && 0 < ExitOnErrorCount) {
          bExit = 1;
          goto LAB_0016fabb;
        }
        bVar6 = false;
        bVar7 = true;
        goto LAB_0016f9d5;
      }
      local_d48 = (long)srf02.threadperiod;
      uSleep(local_d48 * 1000);
      local_d38.tv_sec = 0;
      local_d38.tv_usec = 0;
      angles[0] = 0.0;
      angles[1] = 0.0;
      angles[2] = 0.0;
      angles[3] = 0.0;
      angles[4] = 0.0;
      angles[5] = 0.0;
      angles[6] = 0.0;
      angles[7] = 0.0;
      angles[8] = 0.0;
      angles[9] = 0.0;
      angles[10] = 0.0;
      angles[0xb] = 0.0;
      angles[0xc] = 0.0;
      angles[0xd] = 0.0;
      angles[0xe] = 0.0;
      angles[0xf] = 0.0;
      distances[0] = 0.0;
      distances[1] = 0.0;
      distances[2] = 0.0;
      distances[3] = 0.0;
      distances[4] = 0.0;
      distances[5] = 0.0;
      distances[6] = 0.0;
      distances[7] = 0.0;
      distances[8] = 0.0;
      distances[9] = 0.0;
      distances[10] = 0.0;
      distances[0xb] = 0.0;
      distances[0xc] = 0.0;
      distances[0xd] = 0.0;
      distances[0xe] = 0.0;
      distances[0xf] = 0.0;
      distances1[0] = 0.0;
      distances1[1] = 0.0;
      distances1[2] = 0.0;
      distances1[3] = 0.0;
      distances1[4] = 0.0;
      distances1[5] = 0.0;
      distances1[6] = 0.0;
      distances1[7] = 0.0;
      distances1[8] = 0.0;
      distances1[9] = 0.0;
      distances1[10] = 0.0;
      distances1[0xb] = 0.0;
      distances1[0xc] = 0.0;
      distances1[0xd] = 0.0;
      distances1[0xe] = 0.0;
      distances1[0xf] = 0.0;
      distances2[0xe] = 0.0;
      distances2[0xf] = 0.0;
      distances2[0xc] = 0.0;
      distances2[0xd] = 0.0;
      distances2[10] = 0.0;
      distances2[0xb] = 0.0;
      distances2[8] = 0.0;
      distances2[9] = 0.0;
      distances2[6] = 0.0;
      distances2[7] = 0.0;
      distances2[4] = 0.0;
      distances2[5] = 0.0;
      distances2[2] = 0.0;
      distances2[3] = 0.0;
      distances2[0] = 0.0;
      distances2[1] = 0.0;
      distances3[0] = 0.0;
      distances3[1] = 0.0;
      distances3[2] = 0.0;
      distances3[3] = 0.0;
      distances3[4] = 0.0;
      distances3[5] = 0.0;
      distances3[6] = 0.0;
      distances3[7] = 0.0;
      distances3[8] = 0.0;
      distances3[9] = 0.0;
      distances3[10] = 0.0;
      distances3[0xb] = 0.0;
      distances3[0xc] = 0.0;
      distances3[0xd] = 0.0;
      distances3[0xe] = 0.0;
      distances3[0xf] = 0.0;
      if (srf02.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)srf02.pfSaveFile);
        srf02.pfSaveFile = (FILE *)0x0;
      }
      if (srf02.bSaveRawData == 0) goto LAB_0016f9cb;
      if (srf02.szCfgFilePath[0] == '\0') {
        builtin_strncpy(szTemp,"srf02",6);
      }
      else {
        sprintf(szTemp,"%.127s",srf02.szCfgFilePath);
      }
      sVar10 = strlen(szTemp);
      iVar9 = (int)sVar10 + 1;
      uVar14 = sVar10 & 0xffffffff;
      break;
    }
    if (bVar6) goto LAB_0016f3d1;
    if (srf02.bParallel == 0) {
      iVar9 = Get5TelemetersSRF02(&srf02,distances,distances + 1,distances + 2,distances + 3,
                                  distances + 4,10);
      if (iVar9 == 0) {
        lStackY_d70 = 10;
        goto LAB_0016f600;
      }
    }
    else {
      iVar9 = Get5TelemetersParallelSRF02
                        (&srf02,distances,distances + 1,distances + 2,distances + 3,distances + 4);
      if (iVar9 == 0) goto LAB_0016f5fa;
    }
    puts("Connection to a SRF02 lost.");
    DisconnectSRF02(&srf02);
    uSleep((long)((int)local_d48 * 1000));
    bVar6 = true;
  } while( true );
  while( true ) {
    uVar1 = uVar14 - 1;
    iVar9 = iVar9 + -1;
    lVar13 = uVar14 - 1;
    uVar14 = uVar1;
    if (szTemp[lVar13] == '.') break;
    if ((int)uVar14 < 1) goto LAB_0016fa3f;
  }
  if ((uVar1 != 0) && (iVar9 <= (int)sVar10)) {
    memset(szTemp + (uVar1 & 0xffffffff),0,sVar10 - (uVar1 & 0xffffffff));
  }
LAB_0016fa3f:
  pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
  pcVar11 = strtimeex_fns();
  bVar7 = false;
  sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar11);
  pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
  srf02.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
  bVar6 = true;
  if ((FILE *)srf02.pfSaveFile == (FILE *)0x0) {
    puts("Unable to create SRF02 data file.");
    bVar7 = false;
    goto LAB_0016fabe;
  }
LAB_0016f9d5:
  if (bExit != 0) {
LAB_0016fabe:
    StopChronoQuick(&chrono_period);
    if (srf02.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)srf02.pfSaveFile);
      srf02.pfSaveFile = (FILE *)0x0;
    }
    if (!bVar7) {
      DisconnectSRF02(&srf02);
    }
    if (bExit == 0) {
      bExit = 1;
    }
    return (void *)0x0;
  }
  goto LAB_0016f2af;
LAB_0016f5fa:
  lStackY_d70 = 0x14;
LAB_0016f600:
  mSleep(lStackY_d70);
  iVar9 = gettimeofday(&local_d38,(__timezone_ptr_t)0x0);
  if (iVar9 != 0) {
    local_d38.tv_sec = 0;
    local_d38.tv_usec = 0;
  }
  if (srf02.bMedianFilter != 0) {
    lVar13 = 0x10;
    pdVar15 = distances2;
    pdVar16 = distances3;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      *pdVar16 = *pdVar15;
      pdVar15 = pdVar15 + (ulong)bVar17 * -2 + 1;
      pdVar16 = pdVar16 + (ulong)bVar17 * -2 + 1;
    }
    pdVar15 = distances1;
    pdVar16 = distances2;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      *pdVar16 = *pdVar15;
      pdVar15 = pdVar15 + (ulong)bVar17 * -2 + 1;
      pdVar16 = pdVar16 + (ulong)bVar17 * -2 + 1;
    }
    pdVar15 = distances;
    pdVar16 = distances1;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      *pdVar16 = *pdVar15;
      pdVar15 = pdVar15 + (ulong)bVar17 * -2 + 1;
      pdVar16 = pdVar16 + (ulong)bVar17 * -2 + 1;
    }
    for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
      tab_values[0] = distances1[lVar13];
      tab_values[1] = distances2[lVar13];
      tab_values[2] = distances3[lVar13];
      dVar2 = median(tab_values,3);
      distances[lVar13] = dVar2;
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  dVar3 = srf02.x[0];
  dVar5 = distances[0];
  dVar2 = cos(srf02.psi[0]);
  dVar4 = srf02.y[0];
  dVar8 = distances[0];
  dVar3 = dVar2 * dVar5 + dVar3;
  dVar2 = sin(srf02.psi[0]);
  dVar4 = dVar2 * dVar8 + dVar4;
  angles[0] = atan2(dVar4,dVar3);
  dVar5 = srf02.x[1];
  dVar8 = distances[1];
  distances[0] = SQRT(dVar4 * dVar4 + dVar3 * dVar3);
  dVar2 = cos(srf02.psi[1]);
  dVar3 = srf02.y[1];
  dVar4 = distances[1];
  dVar5 = dVar2 * dVar8 + dVar5;
  dVar2 = sin(srf02.psi[1]);
  dVar3 = dVar2 * dVar4 + dVar3;
  angles[1] = atan2(dVar3,dVar5);
  dVar4 = srf02.x[2];
  dVar8 = distances[2];
  distances[1] = SQRT(dVar3 * dVar3 + dVar5 * dVar5);
  dVar2 = cos(srf02.psi[2]);
  dVar3 = srf02.y[2];
  dVar5 = distances[2];
  dVar4 = dVar2 * dVar8 + dVar4;
  dVar2 = sin(srf02.psi[2]);
  dVar3 = dVar2 * dVar5 + dVar3;
  angles[2] = atan2(dVar3,dVar4);
  dVar5 = srf02.x[3];
  dVar8 = distances[3];
  distances[2] = SQRT(dVar3 * dVar3 + dVar4 * dVar4);
  dVar2 = cos(srf02.psi[3]);
  dVar3 = srf02.y[3];
  dVar4 = distances[3];
  dVar5 = dVar2 * dVar8 + dVar5;
  dVar2 = sin(srf02.psi[3]);
  dVar3 = dVar2 * dVar4 + dVar3;
  angles[3] = atan2(dVar3,dVar5);
  distances[3] = SQRT(dVar3 * dVar3 + dVar5 * dVar5);
  distance_above = srf02.z[4] + distances[4];
  tv.tv_usec = local_d38.tv_usec;
  tv.tv_sec = local_d38.tv_sec;
  set_htelemeters_vectors_SRF02(angles,distances,4,tv);
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
LAB_0016f9cb:
  bVar7 = false;
  bVar6 = true;
  goto LAB_0016f9d5;
}

Assistant:

THREAD_PROC_RETURN_VALUE SRF02Thread(void* pParam)
{
	SRF02 srf02;
	double x = 0, y = 0, z = 0;
	struct timeval tv;
	int nbhtelemeters = 0, nbvtelemeters = 0, nbtelemeters = 0;
	double angles[MAX_NB_DEVICES_SRF02];
	double distances[MAX_NB_DEVICES_SRF02];
	double distances1[MAX_NB_DEVICES_SRF02];
	double distances2[MAX_NB_DEVICES_SRF02];
	double distances3[MAX_NB_DEVICES_SRF02];
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	sprintf(szCfgFilePath, "SRF020.txt");

	memset(&srf02, 0, sizeof(SRF02));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//uSleep(1000*threadperiod);

		if (bPauseSRF02) 
		{
			if (bConnected)
			{
				printf("SRF02 paused.\n");
				bConnected = FALSE;
				DisconnectSRF02(&srf02);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSRF02) 
		{
			if (bConnected)
			{
				printf("Restarting a SRF02.\n");
				bConnected = FALSE;
				DisconnectSRF02(&srf02);
			}
			bRestartSRF02 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSRF02(&srf02, szCfgFilePath) == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = srf02.threadperiod;
				uSleep(1000*threadperiod);

				memset(&tv, 0, sizeof(tv));
				memset(angles, 0, sizeof(angles));
				memset(distances, 0, sizeof(distances));
				memset(distances1, 0, sizeof(distances1));
				memset(distances2, 0, sizeof(distances2));
				memset(distances3, 0, sizeof(distances3));

				if (srf02.pfSaveFile != NULL)
				{
					fclose(srf02.pfSaveFile); 
					srf02.pfSaveFile = NULL;
				}
				if ((srf02.bSaveRawData)&&(srf02.pfSaveFile == NULL)) 
				{
					if (strlen(srf02.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", srf02.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "srf02");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					srf02.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (srf02.pfSaveFile == NULL) 
					{
						printf("Unable to create SRF02 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			//if ((srf02.telem1chan != -1)&&(srf02.telem2chan != -1)&&(srf02.telem3chan != -1)&&(srf02.telem4chan != -1)&&
			//	(srf02.telem5chan != -1))
			{
				// Assume 4 planar+1 up vertical telemeters...
				nbhtelemeters = 4; nbvtelemeters = 1; nbtelemeters = nbhtelemeters+nbvtelemeters;
				if (srf02.bParallel)
				{
					if (Get5TelemetersParallelSRF02(&srf02, &distances[0], &distances[1], &distances[2], &distances[3], &distances[4]) != EXIT_SUCCESS)
					{
						printf("Connection to a SRF02 lost.\n");
						bConnected = FALSE;
						DisconnectSRF02(&srf02);
						uSleep(1000*threadperiod);
						continue;
					}
					mSleep(20);
				}
				else
				{
					if (Get5TelemetersSRF02(&srf02, &distances[0], &distances[1], &distances[2], &distances[3], &distances[4], 10) != EXIT_SUCCESS)
					{
						printf("Connection to a SRF02 lost.\n");
						bConnected = FALSE;
						DisconnectSRF02(&srf02);
						uSleep(1000*threadperiod);
						continue;
					}
					mSleep(10);
				}
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
				if (srf02.bMedianFilter)
				{
					// Median filter with the 3 last values.
					memcpy(distances3, distances2, sizeof(distances));
					memcpy(distances2, distances1, sizeof(distances));
					memcpy(distances1, distances, sizeof(distances));
					for (i = 0; i < nbtelemeters; i++)
					{
						double tab_values[3] = { distances1[i], distances2[i], distances3[i] };					
						distances[i] = median(tab_values, 3);
					}
				}
				//printf("%f %f %f %f %f\n", distances[0], distances[1], distances[2], distances[3], distances[4]);
				EnterCriticalSection(&StateVariablesCS);
				i = 0;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 1;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 2;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 3;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));

				// Up vertical...
				i = 4;
				z = srf02.z[i]+distances[i];
				distance_above = z;

				set_htelemeters_vectors_SRF02(angles, distances, nbhtelemeters, tv);
				LeaveCriticalSection(&StateVariablesCS);
			}
			//else uSleep(1000*threadperiod);
		}

		//printf("SRF02Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}
	
	StopChronoQuick(&chrono_period);

	if (srf02.pfSaveFile != NULL)
	{
		fclose(srf02.pfSaveFile); 
		srf02.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectSRF02(&srf02);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}